

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

bool __thiscall
benchmark::internal::BenchmarkFamilies::FindBenchmarks
          (BenchmarkFamilies *this,string *spec,
          vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          *benchmarks)

{
  uint uVar1;
  Benchmark *pBVar2;
  BenchmarkImp *pBVar3;
  pointer pvVar4;
  int *piVar5;
  pointer __s1;
  pointer piVar6;
  void *__s2;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  uint *puVar11;
  size_t __n;
  int *arg;
  int *piVar12;
  pointer puVar13;
  vector<int,_std::allocator<int>_> *__range5;
  vector<int,_std::allocator<int>_> one_thread;
  MutexLock l;
  string error_msg;
  Regex re;
  vector<int,_std::allocator<int>_> *local_170;
  string local_168;
  vector<int,_std::allocator<int>_> local_148;
  value_type local_128;
  pointer local_b0;
  pointer local_a8;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *local_a0;
  uint *local_98;
  uint *local_90;
  unique_lock<std::mutex> local_88;
  string local_78;
  Regex local_58;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_a0 = benchmarks;
  Regex::Regex(&local_58);
  bVar7 = Regex::Init(&local_58,spec,&local_78);
  if (bVar7) {
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_128.name._M_dataplus._M_p._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_148,(iterator)0x0,(int *)&local_128);
    local_88._M_device = &(this->mutex_).mut_;
    local_88._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_88);
    local_88._M_owns = true;
    puVar13 = (this->families_).
              super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (this->families_).
               super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar13 != local_b0) {
      do {
        pBVar2 = (puVar13->_M_t).
                 super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                 .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
        if (pBVar2 != (Benchmark *)0x0) {
          pBVar3 = pBVar2->imp_;
          pvVar4 = *(pointer *)
                    &(pBVar3->args_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl;
          if ((pvVar4 == *(pointer *)
                          ((long)&(pBVar3->args_).
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          + 8)) ||
             ((~((long)*(pointer *)
                        ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8)
                - *(long *)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl) &
              0x3fffffffcU) == 0)) {
            local_128.name._M_dataplus._M_p = (pointer)0x0;
            local_128.name._M_string_length = 0;
            local_128.name.field_2._M_allocated_capacity = 0;
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back(&pBVar3->args_,(value_type *)&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128.name._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_128.name._M_dataplus._M_p);
            }
          }
          local_170 = *(vector<int,_std::allocator<int>_> **)
                       &(pBVar3->args_).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl;
          local_a8 = *(pointer *)
                      ((long)&(pBVar3->args_).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      + 8);
          if (local_170 != local_a8) {
            do {
              puVar11 = *(uint **)&(pBVar3->thread_counts_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl;
              local_98 = *(uint **)((long)&(pBVar3->thread_counts_).
                                           super__Vector_base<int,_std::allocator<int>_> + 8);
              if (puVar11 == local_98) {
                puVar11 = (uint *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                local_98 = (uint *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
              }
              if (puVar11 != local_98) {
                do {
                  local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
                  uVar1 = *puVar11;
                  local_128.name._M_string_length = 0;
                  local_128.name.field_2._M_allocated_capacity =
                       local_128.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_128.arg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_128.arg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_128.arg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_90 = puVar11;
                  std::__cxx11::string::_M_assign((string *)&local_128);
                  local_128.benchmark =
                       (puVar13->_M_t).
                       super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                       .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
                  local_128.report_mode = pBVar3->report_mode_;
                  std::vector<int,_std::allocator<int>_>::operator=(&local_128.arg,local_170);
                  local_128.time_unit = pBVar3->time_unit_;
                  local_128.range_multiplier = pBVar3->range_multiplier_;
                  local_128.min_time = pBVar3->min_time_;
                  local_128.repetitions = pBVar3->repetitions_;
                  local_128.use_real_time = pBVar3->use_real_time_;
                  local_128.use_manual_time = pBVar3->use_manual_time_;
                  local_128.complexity = pBVar3->complexity_;
                  local_128.complexity_lambda = pBVar3->complexity_lambda_;
                  local_128.multithreaded =
                       *(pointer *)
                        &(pBVar3->thread_counts_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl !=
                       *(pointer *)
                        ((long)&(pBVar3->thread_counts_).
                                super__Vector_base<int,_std::allocator<int>_> + 8);
                  piVar5 = (local_170->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                  local_128.threads = uVar1;
                  for (piVar12 = (local_170->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start; piVar12 != piVar5;
                      piVar12 = piVar12 + 1) {
                    AppendHumanReadable(*piVar12,&local_128.name);
                  }
                  if (2.220446049250313e-16 <= ABS(pBVar3->min_time_)) {
                    StringPrintF_abi_cxx11_(&local_168,"/min_time:%0.3f");
                    std::__cxx11::string::_M_append
                              ((char *)&local_128,(ulong)local_168._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p);
                    }
                  }
                  if (pBVar3->repetitions_ != 0) {
                    StringPrintF_abi_cxx11_(&local_168,"/repeats:%d");
                    std::__cxx11::string::_M_append
                              ((char *)&local_128,(ulong)local_168._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p);
                    }
                  }
                  if ((pBVar3->use_manual_time_ != false) || (pBVar3->use_real_time_ == true)) {
                    std::__cxx11::string::append((char *)&local_128);
                  }
                  if (*(pointer *)
                       &(pBVar3->thread_counts_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl !=
                      *(pointer *)
                       ((long)&(pBVar3->thread_counts_).
                               super__Vector_base<int,_std::allocator<int>_> + 8)) {
                    StringPrintF_abi_cxx11_(&local_168,"/threads:%d",(ulong)(uint)local_128.threads)
                    ;
                    std::__cxx11::string::_M_append
                              ((char *)&local_128,(ulong)local_168._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p);
                    }
                  }
                  bVar8 = Regex::Match(&local_58,&local_128.name);
                  if (bVar8) {
                    pvVar4 = *(pointer *)
                              ((long)&(pBVar3->args_).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              + 8);
                    __s1 = (local_170->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                    piVar6 = (local_170->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                    __n = (long)piVar6 - (long)__s1;
                    __s2 = *(void **)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl;
                    if (__n == (long)*(pointer *)
                                      ((long)&pvVar4[-1].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) - (long)__s2) {
                      if (piVar6 == __s1) {
                        local_128.last_benchmark_instance = true;
                      }
                      else {
                        iVar9 = bcmp(__s1,__s2,__n);
                        local_128.last_benchmark_instance = iVar9 == 0;
                      }
                    }
                    else {
                      local_128.last_benchmark_instance = false;
                    }
                    std::
                    vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ::push_back(local_a0,&local_128);
                  }
                  if (local_128.arg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_128.arg.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128.name._M_dataplus._M_p != &local_128.name.field_2) {
                    operator_delete(local_128.name._M_dataplus._M_p);
                  }
                  puVar11 = local_90 + 1;
                } while (puVar11 != local_98);
              }
              local_170 = local_170 + 1;
            } while (local_170 != local_a8);
          }
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != local_b0);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_88);
    if ((uint *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not compile benchmark re: ",0x20);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  Regex::~Regex(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return bVar7;
}

Assistant:

bool BenchmarkFamilies::FindBenchmarks(
    const std::string& spec,
    std::vector<Benchmark::Instance>* benchmarks) {
  // Make regular expression out of command-line flag
  std::string error_msg;
  Regex re;
  if (!re.Init(spec, &error_msg)) {
    std::cerr << "Could not compile benchmark re: " << error_msg << std::endl;
    return false;
  }

  // Special list of thread counts to use when none are specified
  std::vector<int> one_thread;
  one_thread.push_back(1);

  MutexLock l(mutex_);
  for (std::unique_ptr<Benchmark>& bench_family : families_) {
    // Family was deleted or benchmark doesn't match
    if (!bench_family) continue;
    BenchmarkImp* family = bench_family->imp_;

    if (family->ArgsCnt() == -1) {
      family->Args({});
    }

    for (auto const& args : family->args_) {
      const std::vector<int>* thread_counts =
        (family->thread_counts_.empty()
         ? &one_thread
         : &family->thread_counts_);
      for (int num_threads : *thread_counts) {

        Benchmark::Instance instance;
        instance.name = family->name_;
        instance.benchmark = bench_family.get();
        instance.report_mode = family->report_mode_;
        instance.arg = args;
        instance.time_unit = family->time_unit_;
        instance.range_multiplier = family->range_multiplier_;
        instance.min_time = family->min_time_;
        instance.repetitions = family->repetitions_;
        instance.use_real_time = family->use_real_time_;
        instance.use_manual_time = family->use_manual_time_;
        instance.complexity = family->complexity_;
        instance.complexity_lambda = family->complexity_lambda_;
        instance.threads = num_threads;
        instance.multithreaded = !(family->thread_counts_.empty());

        // Add arguments to instance name
        for (auto const& arg : args) {
          AppendHumanReadable(arg, &instance.name);
        }

        if (!IsZero(family->min_time_)) {
          instance.name +=  StringPrintF("/min_time:%0.3f",  family->min_time_);
        }
        if (family->repetitions_ != 0) {
          instance.name +=  StringPrintF("/repeats:%d",  family->repetitions_);
        }
        if (family->use_manual_time_) {
          instance.name +=  "/manual_time";
        } else if (family->use_real_time_) {
          instance.name +=  "/real_time";
        }

        // Add the number of threads used to the name
        if (!family->thread_counts_.empty()) {
          instance.name += StringPrintF("/threads:%d", instance.threads);
        }

        if (re.Match(instance.name)) {
          instance.last_benchmark_instance = (args == family->args_.back());
          benchmarks->push_back(instance);
        }
      }
    }
  }
  return true;
}